

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O0

void toggle_object_in_list(Am_Object *widget,Am_Object *new_object,Am_Value_List *list)

{
  Am_Object AVar1;
  bool bVar2;
  bool bVar3;
  Am_Wrapper *pAVar4;
  Am_Value *in_value;
  bool local_82;
  Am_Object local_68;
  byte local_59;
  Am_Object local_58;
  byte local_49;
  Am_Object local_48 [3];
  Am_Object local_30;
  Am_Object local_28;
  Am_Object item;
  Am_Value_List *list_local;
  Am_Object *new_object_local;
  Am_Object *widget_local;
  
  item.data = (Am_Object_Data *)list;
  Am_Value_List::Start(list);
  AVar1.data = item.data;
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
  bVar2 = Am_Value_List::Member((Am_Value_List *)AVar1.data,pAVar4);
  if (bVar2) {
    Am_Value_List::Delete((Am_Value_List *)item.data,true);
  }
  else {
    Am_Value_List::Start((Am_Value_List *)item.data);
    while (bVar2 = Am_Value_List::Last((Am_Value_List *)item.data), AVar1 = item,
          ((bVar2 ^ 0xffU) & 1) != 0) {
      in_value = Am_Value_List::Get((Am_Value_List *)item.data);
      Am_Object::Am_Object(&local_28,in_value);
      local_49 = 0;
      local_59 = 0;
      bVar2 = false;
      Am_Object::Am_Object(&local_30,new_object);
      bVar3 = Am_Object::Is_Part_Of(&local_28,&local_30);
      local_82 = true;
      if (!bVar3) {
        Am_Object::Am_Object(local_48,&local_28);
        local_49 = 1;
        bVar3 = Am_Object::Is_Part_Of(new_object,local_48);
        local_82 = true;
        if (!bVar3) {
          Am_Object::Get_Owner(&local_58,(Am_Slot_Flags)&local_28);
          local_59 = 1;
          Am_Object::Get_Owner(&local_68,(Am_Slot_Flags)new_object);
          bVar2 = true;
          local_82 = Am_Object::operator!=(&local_58,&local_68);
        }
      }
      if (bVar2) {
        Am_Object::~Am_Object(&local_68);
      }
      if ((local_59 & 1) != 0) {
        Am_Object::~Am_Object(&local_58);
      }
      if ((local_49 & 1) != 0) {
        Am_Object::~Am_Object(local_48);
      }
      Am_Object::~Am_Object(&local_30);
      if (local_82 != false) {
        Am_Value_List::Delete((Am_Value_List *)item.data,true);
      }
      Am_Object::~Am_Object(&local_28);
      Am_Value_List::Next((Am_Value_List *)item.data);
    }
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(new_object);
    Am_Value_List::Add((Am_Value_List *)AVar1.data,pAVar4,Am_TAIL,true);
  }
  return;
}

Assistant:

void
toggle_object_in_list(const Am_Object &widget, Am_Object new_object,
                      Am_Value_List &list)
{
  list.Start();
  if (list.Member(new_object)) {
    Am_INTER_TRACE_PRINT(widget, "Selection handle removing "
                                     << new_object << " from " << widget);
    list.Delete();
  } else { // not a member, add it
    Am_INTER_TRACE_PRINT(widget, "Selection handle adding "
                                     << new_object << " to " << widget);
    // Not allowed to have objects selected that are parts of
    // new_object, owners of new_object, or have owners different from
    // new_object.  This can happen when you have select into groups.
    for (list.Start(); !list.Last(); list.Next()) {
      Am_Object item = list.Get();
      if (item.Is_Part_Of(new_object) || new_object.Is_Part_Of(item) ||
          item.Get_Owner() != new_object.Get_Owner())
        list.Delete();
    }
    list.Add(new_object);
  }
}